

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.c
# Opt level: O2

HT_Timeline *
ht_timeline_create(size_t buffer_capacity,HT_Boolean thread_safe,HT_Boolean serialize_events,
                  char *listeners,HT_ErrorCode *out_err)

{
  HT_Timeline *__s;
  HT_Byte *pHVar1;
  HT_TimelineListenerContainer *pHVar2;
  HT_Mutex *pHVar3;
  HT_EventIdProvider *pHVar4;
  HT_ErrorCode HVar5;
  
  __s = (HT_Timeline *)ht_alloc(0x138);
  if (__s == (HT_Timeline *)0x0) {
    HVar5 = HT_ERR_OK;
  }
  else {
    pHVar1 = (HT_Byte *)ht_alloc(buffer_capacity);
    __s->buffer = pHVar1;
    if (pHVar1 == (HT_Byte *)0x0) {
      HVar5 = HT_ERR_OUT_OF_MEMORY;
    }
    else {
      pHVar2 = ht_find_or_create_listener(listeners);
      __s->listeners = pHVar2;
      if (pHVar2 != (HT_TimelineListenerContainer *)0x0) {
        if (thread_safe == 0) {
          __s->locking_policy = (_HT_Mutex *)0x0;
        }
        else {
          pHVar3 = ht_mutex_create();
          __s->locking_policy = pHVar3;
          if (pHVar3 == (HT_Mutex *)0x0) {
            ht_timeline_listener_container_unref(__s->listeners);
            HVar5 = HT_ERR_OUT_OF_MEMORY;
            goto LAB_00108c4b;
          }
        }
        __s->buffer_usage = 0;
        __s->buffer_capacity = buffer_capacity;
        pHVar4 = ht_event_id_provider_get_default();
        __s->id_provider = pHVar4;
        __s->serialize_events = serialize_events;
        HVar5 = HT_ERR_OK;
        memset(__s,0,0x100);
        goto LAB_00108c64;
      }
      HVar5 = HT_ERR_CANT_CREATE_LISTENER_CONTAINER;
LAB_00108c4b:
      ht_free(__s->buffer);
    }
    ht_free(__s);
  }
  __s = (HT_Timeline *)0x0;
LAB_00108c64:
  if (out_err != (HT_ErrorCode *)0x0) {
    *out_err = HVar5;
  }
  return __s;
}

Assistant:

HT_Timeline*
ht_timeline_create(size_t buffer_capacity,
                   HT_Boolean thread_safe,
                   HT_Boolean serialize_events,
                   const char* listeners,
                   HT_ErrorCode* out_err)
{
    HT_ErrorCode error_code = HT_ERR_OK;
    HT_Timeline* timeline = HT_CREATE_TYPE(HT_Timeline);

    if (timeline == NULL)
    {
        goto done;
    }

    timeline->buffer = (HT_Byte*)ht_alloc(buffer_capacity);

    if (timeline->buffer == NULL)
    {
        error_code = HT_ERR_OUT_OF_MEMORY;
        goto error_allocate_buffer;
    }

    timeline->listeners = ht_find_or_create_listener(listeners);
    if (timeline->listeners == NULL)
    {
        error_code = HT_ERR_CANT_CREATE_LISTENER_CONTAINER;
        goto error_create_listener;
    }

    if (thread_safe)
    {
        timeline->locking_policy = ht_mutex_create();
        if (timeline->locking_policy == NULL)
        {
            error_code = HT_ERR_OUT_OF_MEMORY;
            goto error_locking_policy;
        }
    }
    else
    {
        timeline->locking_policy = NULL;
    }

    timeline->buffer_usage = 0;
    timeline->buffer_capacity = buffer_capacity;
    timeline->id_provider = ht_event_id_provider_get_default();
    timeline->serialize_events = serialize_events;
    memset(timeline->features, 0, sizeof(timeline->features));

    goto done;

error_locking_policy:
    ht_timeline_listener_container_unref(timeline->listeners);
error_create_listener:
    ht_free(timeline->buffer);
error_allocate_buffer:
    ht_free(timeline);
    timeline = NULL;
done:
    HT_SET_ERROR(out_err, error_code);

    return timeline;
}